

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::dict::dict(dict *this)

{
  PyObject *pPVar1;
  
  pPVar1 = (PyObject *)PyDict_New();
  (this->super_object).super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    return;
  }
  pybind11_fail("Could not allocate dict object!");
}

Assistant:

dict() : object(PyDict_New(), stolen_t{}) {
        if (!m_ptr) {
            pybind11_fail("Could not allocate dict object!");
        }
    }